

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O0

int secp256k1_fe_equal(secp256k1_fe *a,secp256k1_fe *b)

{
  int iVar1;
  secp256k1_fe na;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  secp256k1_fe *in_stack_ffffffffffffffc0;
  
  secp256k1_fe_verify(in_stack_ffffffffffffffc0);
  secp256k1_fe_verify(in_stack_ffffffffffffffc0);
  secp256k1_fe_verify_magnitude(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  secp256k1_fe_verify_magnitude(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  secp256k1_fe_negate_unchecked
            (in_stack_ffffffffffffffc0,
             (secp256k1_fe *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
  secp256k1_fe_add(in_stack_ffffffffffffffc0,
                   (secp256k1_fe *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  iVar1 = secp256k1_fe_normalizes_to_zero((secp256k1_fe *)0x10925d);
  return iVar1;
}

Assistant:

SECP256K1_INLINE static int secp256k1_fe_equal(const secp256k1_fe *a, const secp256k1_fe *b) {
    secp256k1_fe na;
    SECP256K1_FE_VERIFY(a);
    SECP256K1_FE_VERIFY(b);
    SECP256K1_FE_VERIFY_MAGNITUDE(a, 1);
    SECP256K1_FE_VERIFY_MAGNITUDE(b, 31);

    secp256k1_fe_negate(&na, a, 1);
    secp256k1_fe_add(&na, b);
    return secp256k1_fe_normalizes_to_zero(&na);
}